

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O0

ExpEmit __thiscall FxCompareEq::Emit(FxCompareEq *this,VMFunctionBuilder *build)

{
  FxExpression *pFVar1;
  undefined2 uVar2;
  int iVar3;
  bool bVar4;
  int local_40;
  ExpEmit local_30;
  int local_2c;
  undefined1 local_26 [2];
  int instr;
  ExpEmit op2;
  VMFunctionBuilder *pVStack_20;
  ExpEmit op1;
  VMFunctionBuilder *build_local;
  FxCompareEq *this_local;
  ExpEmit to;
  
  pFVar1 = (this->super_FxBinary).left;
  pVStack_20 = build;
  iVar3 = (*pFVar1->_vptr_FxExpression[7])(pFVar1,build);
  instr._1_2_ = (undefined2)iVar3;
  instr._3_1_ = (byte)((uint)iVar3 >> 0x10);
  pFVar1 = (this->super_FxBinary).right;
  iVar3 = (*pFVar1->_vptr_FxExpression[7])(pFVar1,pVStack_20);
  uVar2 = (undefined2)iVar3;
  instr._0_1_ = (byte)((uint)iVar3 >> 0x10);
  local_26[1] = (BYTE)((uint)iVar3 >> 8);
  local_26 = (undefined1  [2])uVar2;
  if (instr._2_1_ != local_26[1]) {
    __assert_fail("op1.RegType == op2.RegType",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                  ,0x6f7,"virtual ExpEmit FxCompareEq::Emit(VMFunctionBuilder *)");
  }
  bVar4 = true;
  if ((instr._2_1_ != '\0') && (bVar4 = true, instr._2_1_ != '\x01')) {
    bVar4 = instr._2_1_ == '\x03';
  }
  if (bVar4) {
    if ((instr._3_1_ & 1) != 0) {
      swapvalues<ExpEmit>((ExpEmit *)((long)&instr + 1),(ExpEmit *)local_26);
    }
    if ((instr._3_1_ & 1) == 0) {
      ExpEmit::ExpEmit((ExpEmit *)((long)&this_local + 5),pVStack_20,0);
      if (instr._2_1_ == '\0') {
        local_40 = 0x73;
      }
      else {
        local_40 = 0xb3;
        if (instr._2_1_ == '\x01') {
          local_40 = 0x97;
        }
      }
      local_2c = local_40;
      ExpEmit::Free((ExpEmit *)((long)&instr + 1),pVStack_20);
      if (((byte)instr & 1) == 0) {
        ExpEmit::Free((ExpEmit *)local_26,pVStack_20);
      }
      else {
        local_2c = local_40 + 1;
      }
      VMFunctionBuilder::Emit(pVStack_20,1,(uint)this_local._5_1_,0,0);
      VMFunctionBuilder::Emit
                (pVStack_20,local_2c,
                 (uint)(*(int *)&(this->super_FxBinary).super_FxExpression.field_0x34 != 0x11f),
                 (uint)instr._1_1_,(uint)local_26[0]);
      VMFunctionBuilder::Emit(pVStack_20,0x37,1);
      VMFunctionBuilder::Emit(pVStack_20,1,(uint)this_local._5_1_,1);
      local_30._2_1_ = this_local._7_1_;
      local_30.RegNum = this_local._5_1_;
      local_30.RegType = this_local._6_1_;
      return local_30;
    }
    __assert_fail("!op1.Konst",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                  ,0x700,"virtual ExpEmit FxCompareEq::Emit(VMFunctionBuilder *)");
  }
  __assert_fail("op1.RegType == REGT_INT || op1.RegType == REGT_FLOAT || op1.RegType == REGT_POINTER"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                ,0x6f8,"virtual ExpEmit FxCompareEq::Emit(VMFunctionBuilder *)");
}

Assistant:

ExpEmit FxCompareEq::Emit(VMFunctionBuilder *build)
{
	ExpEmit op1 = left->Emit(build);
	ExpEmit op2 = right->Emit(build);
	assert(op1.RegType == op2.RegType);
	assert(op1.RegType == REGT_INT || op1.RegType == REGT_FLOAT || op1.RegType == REGT_POINTER);
	int instr;

	// Only the second operand may be constant.
	if (op1.Konst)
	{
		swapvalues(op1, op2);
	}
	assert(!op1.Konst);

	ExpEmit to(build, REGT_INT);

	instr = op1.RegType == REGT_INT ? OP_EQ_R :
			op1.RegType == REGT_FLOAT ? OP_EQF_R :
			OP_EQA_R;
	op1.Free(build);
	if (!op2.Konst)
	{
		op2.Free(build);
	}
	else
	{
		instr += 1;
	}

	// See FxUnaryNotBoolean for comments, since it's the same thing.
	build->Emit(OP_LI, to.RegNum, 0, 0);
	build->Emit(instr, Operator != TK_Eq, op1.RegNum, op2.RegNum);
	build->Emit(OP_JMP, 1);
	build->Emit(OP_LI, to.RegNum, 1);
	return to;
}